

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIP.c
# Opt level: O0

GeoIPRegion * GeoIP_region_by_ipnum_v6(GeoIP *gi,geoipv6_t ipnum)

{
  GeoIP *gi_local;
  geoipv6_t ipnum_local;
  
  if ((gi->databaseType == '\a') || (gi->databaseType == '\x03')) {
    ipnum_local.__in6_u._8_8_ = _get_region_v6(gi,ipnum);
  }
  else {
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[(int)gi->databaseType],
           GeoIPDBDescription[3]);
    ipnum_local.__in6_u._8_8_ = 0;
  }
  return (GeoIPRegion *)ipnum_local.__in6_u._8_8_;
}

Assistant:

GeoIPRegion * GeoIP_region_by_ipnum_v6 (GeoIP* gi, geoipv6_t ipnum) {
       if (gi->databaseType != GEOIP_REGION_EDITION_REV0 &&
                       gi->databaseType != GEOIP_REGION_EDITION_REV1) {
               printf("Invalid database type %s, expected %s\n", GeoIPDBDescription[(int)gi->databaseType], GeoIPDBDescription[GEOIP_REGION_EDITION_REV1]);
               return 0;
       }
       return _get_region_v6(gi, ipnum);
}